

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bstrListAlloc(bstrList *sl,int msz)

{
  int iVar1;
  uint uVar2;
  bstring *pptVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = -1;
  if ((((0 < msz && sl != (bstrList *)0x0) && (sl->entry != (bstring *)0x0)) && (-1 < sl->qty)) &&
     (iVar1 = sl->mlen, sl->qty <= iVar1 && 0 < iVar1)) {
    if (iVar1 < msz) {
      uVar5 = 8;
      if ((7 < msz) &&
         (uVar2 = (uint)msz >> 1 | msz, uVar2 = uVar2 >> 2 | uVar2, uVar2 = uVar2 >> 4 | uVar2,
         uVar2 = uVar2 >> 8 | uVar2, uVar2 = (uVar2 >> 0x10 | uVar2) + 1, uVar5 = (ulong)uVar2,
         (int)uVar2 <= msz)) {
        uVar5 = (ulong)(uint)msz;
      }
      if (uVar5 * 8 < uVar5) {
        return -1;
      }
      pptVar3 = (bstring *)realloc(sl->entry,uVar5 * 8);
      iVar4 = (int)uVar5;
      if ((pptVar3 == (bstring *)0x0) &&
         (pptVar3 = (bstring *)realloc(sl->entry,(ulong)(uint)msz << 3), iVar4 = msz,
         pptVar3 == (bstring *)0x0)) {
        return -1;
      }
      sl->mlen = iVar4;
      sl->entry = pptVar3;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int bstrListAlloc (struct bstrList * sl, int msz) {
bstring * l;
int smsz;
size_t nsz;
	if (!sl || msz <= 0 || !sl->entry || sl->qty < 0 || sl->mlen <= 0 ||
	    sl->qty > sl->mlen) return BSTR_ERR;
	if (sl->mlen >= msz) return BSTR_OK;
	smsz = snapUpSize (msz);
	nsz = ((size_t) smsz) * sizeof (bstring);
	if (nsz < (size_t) smsz) return BSTR_ERR;
	l = (bstring *) bstr__realloc (sl->entry, nsz);
	if (!l) {
		smsz = msz;
		nsz = ((size_t) smsz) * sizeof (bstring);
		l = (bstring *) bstr__realloc (sl->entry, nsz);
		if (!l) return BSTR_ERR;
	}
	sl->mlen = smsz;
	sl->entry = l;
	return BSTR_OK;
}